

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::LowPrecisionQuantizeTest_MultipleQ_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::LowPrecisionQuantizeTest_MultipleQ_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<void(*)(short_const*,long,short_const*,short_const*,short*,short*,short_const*,unsigned_short*,short_const*,short_const*),void(*)(short_const*,long,short_const*,short_const*,short*,short*,short_const*,unsigned_short*,short_const*,short_const*),unsigned_char,(anonymous_namespace)::QuantType,aom_bit_depth>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x50);
  anon_unknown.dwarf_1ebcf96::LowPrecisionQuantizeTest::LowPrecisionQuantizeTest
            ((LowPrecisionQuantizeTest *)this_00);
  (((QuantizeTestBase<short,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*)>
     *)&this_00->_vptr_Test)->
  super_TestWithParam<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f6ecc0;
  this_00[1]._vptr_Test = (_func_int **)&PTR__LowPrecisionQuantizeTest_MultipleQ_Test_00f6ed08;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }